

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

spirv_cross * __thiscall
spirv_cross::convert_to_string_abi_cxx11_(spirv_cross *this,double t,char locale_radix_point)

{
  char *pcVar1;
  allocator local_69;
  char local_68 [8];
  char buf [64];
  char locale_radix_point_local;
  double t_local;
  
  sprintf(local_68,"%.32g",t);
  fixup_radix_point(local_68,locale_radix_point);
  pcVar1 = strchr(local_68,0x2e);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strchr(local_68,0x65);
    if (pcVar1 == (char *)0x0) {
      strcat(local_68,".0");
    }
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)this,local_68,&local_69);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return this;
}

Assistant:

inline std::string convert_to_string(double t, char locale_radix_point)
{
	// std::to_string for floating point values is broken.
	// Fallback to something more sane.
	char buf[64];
	sprintf(buf, SPIRV_CROSS_FLT_FMT, t);
	fixup_radix_point(buf, locale_radix_point);

	// Ensure that the literal is float.
	if (!strchr(buf, '.') && !strchr(buf, 'e'))
		strcat(buf, ".0");
	return buf;
}